

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

QString * __thiscall
MakefileGenerator::valList
          (QString *__return_storage_ptr__,MakefileGenerator *this,ProStringList *varList)

{
  MakefileGenerator *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString((QString *)&local_50,"");
  QString::QString((QString *)&local_68," \\\n\t\t");
  this_00 = (MakefileGenerator *)0x219c51;
  QString::QString((QString *)&local_80,"");
  valGlue(__return_storage_ptr__,this_00,varList,(QString *)&local_50,(QString *)&local_68,
          (QString *)&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
MakefileGenerator::valList(const ProStringList &varList) const
{
    return valGlue(varList, "", " \\\n\t\t", "");
}